

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * kj::_::fillLimited<kj::ArrayPtr<char>,kj::StringPtr&>
                 (char *target,char *limit,ArrayPtr<char> *first,StringPtr *rest)

{
  char *target_00;
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  pcVar2 = first->ptr;
  sVar1 = first->size_;
  sVar3 = 0;
  while( true ) {
    target_00 = target + sVar3;
    if (sVar1 == sVar3) {
      pcVar2 = fillLimited<kj::StringPtr>(target_00,limit,rest);
      return pcVar2;
    }
    if (target_00 == limit) break;
    *target_00 = pcVar2[sVar3];
    sVar3 = sVar3 + 1;
  }
  return target_00;
}

Assistant:

inline constexpr const T* end() const { return ptr + size_; }